

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O2

void glu::drawFromVAOBuffers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  int iVar1;
  undefined4 extraout_var;
  VertexArray vao;
  ObjectWrapper local_48;
  
  iVar1 = (*context->_vptr_RenderContext[3])();
  TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&local_48,context);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xd8))(local_48.m_object);
  drawFromBuffers(context,program,numVertexArrays,vertexArrays,primitives,callback);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xd8))(0);
  ObjectWrapper::~ObjectWrapper(&local_48);
  return;
}

Assistant:

void drawFromVAOBuffers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&	gl		= context.getFunctions();
	VertexArray				vao		(context);

	gl.bindVertexArray(*vao);
	drawFromBuffers(context, program, numVertexArrays, vertexArrays, primitives, callback);
	gl.bindVertexArray(0);
}